

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_query_result.cpp
# Opt level: O1

vector<duckdb::unique_ptr<duckdb::ArrowArrayWrapper,_std::default_delete<duckdb::ArrowArrayWrapper>,_true>,_true>
* __thiscall duckdb::ArrowQueryResult::Arrays(ArrowQueryResult *this)

{
  pointer pcVar1;
  bool bVar2;
  InvalidInputException *this_00;
  string *psVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string local_48;
  
  bVar2 = BaseQueryResult::HasError((BaseQueryResult *)this);
  if (!bVar2) {
    return &this->arrays;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,
             "Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s","");
  psVar3 = BaseQueryResult::GetError_abi_cxx11_((BaseQueryResult *)this);
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  pcVar1 = (psVar3->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + psVar3->_M_string_length);
  InvalidInputException::InvalidInputException<std::__cxx11::string>(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

vector<unique_ptr<ArrowArrayWrapper>> &ArrowQueryResult::Arrays() {
	if (HasError()) {
		throw InvalidInputException("Attempting to fetch ArrowArrays from an unsuccessful query result\n: Error %s",
		                            GetError());
	}
	return arrays;
}